

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_MffcDeref_rec(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  dVar6 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  iVar4 = (int)((float)dVar6 * 1000.0);
  iVar1 = (pObj->vFanins).nSize;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
      iVar2 = (pObj_00->vFanouts).nSize;
      if (iVar2 < 1) {
        __assert_fail("pFanin->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x2b7,"int Sfm_MffcDeref_rec(Abc_Obj_t *)");
      }
      iVar2 = iVar2 + -1;
      (pObj_00->vFanouts).nSize = iVar2;
      if (((iVar2 == 0) && (uVar3 = *(uint *)&pObj_00->field_0x14 & 0xf, uVar3 != 2)) &&
         (uVar3 != 5)) {
        iVar1 = Sfm_MffcDeref_rec(pObj_00);
        iVar4 = iVar4 + iVar1;
        iVar1 = (pObj->vFanins).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar1);
  }
  return iVar4;
}

Assistant:

int Sfm_MffcDeref_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcDeref_rec( pFanin );
    }
    return Area;
}